

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void mips_cpu_do_transaction_failed_mipsel
               (CPUState *cs,hwaddr physaddr,vaddr addr,uint size,MMUAccessType access_type,
               int mmu_idx,MemTxAttrs attrs,MemTxResult response,uintptr_t retaddr)

{
  if (access_type == MMU_INST_FETCH) {
    do_raise_exception((CPUMIPSState_conflict2 *)(cs[1].tb_jmp_cache + 0x13f),0xf,retaddr);
  }
  do_raise_exception((CPUMIPSState_conflict2 *)(cs[1].tb_jmp_cache + 0x13f),0x1c,retaddr);
}

Assistant:

void mips_cpu_do_transaction_failed(CPUState *cs, hwaddr physaddr,
                                    vaddr addr, unsigned size,
                                    MMUAccessType access_type,
                                    int mmu_idx, MemTxAttrs attrs,
                                    MemTxResult response, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;

    if (access_type == MMU_INST_FETCH) {
        do_raise_exception(env, EXCP_IBE, retaddr);
    } else {
        do_raise_exception(env, EXCP_DBE, retaddr);
    }
}